

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

size_type __thiscall
google::
sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
::erase(sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
        *this,key_type *key)

{
  iterator iVar1;
  iterator iVar2;
  iterator iVar3;
  nonempty_iterator ppVar4;
  size_type sVar5;
  iterator local_78;
  
  sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
  ::find<HashObject<8,8>>
            (&local_78,
             (sparse_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
              *)this,key);
  ppVar4 = local_78.pos.col_current;
  iVar3._M_current = local_78.pos.row_current._M_current;
  iVar2._M_current = local_78.pos.row_end._M_current;
  iVar1._M_current = local_78.pos.row_begin._M_current;
  local_78.pos.row_begin._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.pos.row_end._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.pos.col_current = (nonempty_iterator)0x0;
  local_78.end.col_current = (nonempty_iterator)0x0;
  local_78.ht = this;
  local_78.pos.row_current._M_current = local_78.pos.row_end._M_current;
  local_78.end.row_begin._M_current = local_78.pos.row_begin._M_current;
  local_78.end.row_end._M_current = local_78.pos.row_end._M_current;
  local_78.end.row_current._M_current = local_78.pos.row_end._M_current;
  sparse_hashtable_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::advance_past_deleted(&local_78);
  if ((((iVar1._M_current != local_78.pos.row_begin._M_current) ||
       (iVar2._M_current != local_78.pos.row_end._M_current)) ||
      (iVar3._M_current != local_78.pos.row_current._M_current)) ||
     ((sVar5 = 0, iVar3._M_current != iVar2._M_current && (ppVar4 != local_78.pos.col_current)))) {
    g_num_copies = g_num_copies + 1;
    (ppVar4->first).i_ = (this->key_info).delkey.i_;
    *(undefined4 *)(ppVar4->first).buffer_ = *(undefined4 *)(this->key_info).delkey.buffer_;
    ppVar4->second = 0;
    this->num_deleted = this->num_deleted + 1;
    (this->settings).super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
    consider_shrink_ = true;
    sVar5 = 1;
  }
  return sVar5;
}

Assistant:

size_type erase(const key_type& key) {
    // First, double-check we're not erasing delkey.
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) &&
           "Erasing the deleted key");
    assert(!settings.use_deleted() || !equals(key, key_info.delkey));
    const_iterator pos = find(key);  // shrug: shouldn't need to be const
    if (pos != end()) {
      assert(!test_deleted(pos));  // or find() shouldn't have returned it
      set_deleted(pos);
      ++num_deleted;
      // will think about shrink after next insert
      settings.set_consider_shrink(true);
      return 1;  // because we deleted one thing
    } else {
      return 0;  // because we deleted nothing
    }
  }